

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,ConditionalStatement *stmt)

{
  DataFlowState *pDVar1;
  EVP_PKEY_CTX *other;
  long lVar2;
  Condition *cond;
  pointer pCVar3;
  DataFlowState falseState;
  type trueState;
  DataFlowState local_2d8;
  DataFlowState local_238;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_198;
  DataFlowState local_170;
  DataFlowState local_d0;
  
  DataFlowAnalysis::unreachableState((DataFlowAnalysis *)this);
  pCVar3 = (stmt->conditions)._M_ptr;
  for (lVar2 = (stmt->conditions)._M_extent._M_extent_value << 4; lVar2 != 0; lVar2 = lVar2 + -0x10)
  {
    visitCondition((ConstantValue *)&local_198,this,(pCVar3->expr).ptr);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_198);
    if (pCVar3->pattern != (Pattern *)0x0) {
      ast::Pattern::visit<slang::analysis::DataFlowAnalysis>
                (pCVar3->pattern,(DataFlowAnalysis *)this);
    }
    DataFlowAnalysis::joinState((DataFlowAnalysis *)this,&local_2d8,&this->stateWhenFalse);
    DataFlowState::DataFlowState(&local_d0,&this->stateWhenTrue);
    pDVar1 = &local_d0;
    setState(this,&local_d0);
    SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_d0,
               (EVP_PKEY_CTX *)pDVar1);
    pCVar3 = pCVar3 + 1;
  }
  ast::Statement::visit<slang::analysis::DataFlowAnalysis&>(stmt->ifTrue,(DataFlowAnalysis *)this);
  other = (EVP_PKEY_CTX *)&this->state;
  DataFlowState::DataFlowState(&local_238,(DataFlowState *)other);
  pDVar1 = &local_170;
  DataFlowState::DataFlowState(pDVar1,&local_2d8);
  setState(this,pDVar1);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_170,
             (EVP_PKEY_CTX *)pDVar1);
  if (stmt->ifFalse != (Statement *)0x0) {
    ast::Statement::visit<slang::analysis::DataFlowAnalysis&>
              (stmt->ifFalse,(DataFlowAnalysis *)this);
  }
  DataFlowAnalysis::joinState((DataFlowAnalysis *)this,(DataFlowState *)other,&local_238);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_238,
             other);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&local_2d8,
             other);
  return;
}

Assistant:

void visitStmt(const ConditionalStatement& stmt) {
        auto falseState = (DERIVED).unreachableState();
        for (auto& cond : stmt.conditions) {
            visitCondition(*cond.expr);

            if (cond.pattern)
                visit(*cond.pattern);

            (DERIVED).joinState(falseState, stateWhenFalse);
            setState(std::move(stateWhenTrue));
        }

        visit(stmt.ifTrue);

        auto trueState = std::move(state);
        setState(std::move(falseState));
        if (stmt.ifFalse)
            visit(*stmt.ifFalse);

        (DERIVED).joinState(state, trueState);
    }